

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O3

target_ulong helper_extp_mips64(target_ulong ac,target_ulong size,CPUMIPSState_conflict5 *env)

{
  target_ulong tVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  target_ulong dspc;
  
  uVar4 = (uint)size & 0x1f;
  tVar1 = (env->active_tc).DSPControl;
  uVar5 = (uint)tVar1;
  if ((uVar5 & 0x7f) < uVar4) {
    uVar5 = uVar5 | 0x4000;
    uVar4 = 0;
  }
  else {
    bVar2 = (byte)uVar4;
    bVar3 = bVar2 ^ 0x1f;
    uVar4 = (uint)((int)(((ulong)(uint)(env->active_tc).LO[ac] | (env->active_tc).HI[ac] << 0x20) >>
                        (((byte)tVar1 & 0x7f) - bVar2 & 0x3f)) << bVar3) >> bVar3;
    uVar5 = uVar5 & 0xffffbfff;
  }
  (env->active_tc).DSPControl = (ulong)uVar5;
  return (ulong)uVar4;
}

Assistant:

target_ulong helper_extp(target_ulong ac, target_ulong size, CPUMIPSState *env)
{
    int32_t start_pos;
    int sub;
    uint32_t temp;
    uint64_t acc;

    size = size & 0x1F;

    temp = 0;
    start_pos = get_DSPControl_pos(env);
    sub = start_pos - (size + 1);
    if (sub >= -1) {
        acc = ((uint64_t)env->active_tc.HI[ac] << 32) |
              ((uint64_t)env->active_tc.LO[ac] & MIPSDSP_LLO);
        temp = (acc >> (start_pos - size)) & (~0U >> (31 - size));
        set_DSPControl_efi(0, env);
    } else {
        set_DSPControl_efi(1, env);
    }

    return (target_ulong)temp;
}